

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

ushort __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::BuildFreeBitVector
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,SmallHeapBlockBitVector *free)

{
  code *pcVar1;
  anon_class_24_3_be079e9c fn;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  BVIndex BVar5;
  undefined4 *puVar6;
  FreeObject *this_00;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_01;
  uint uVar7;
  SmallHeapBlockBitVector *local_40;
  SmallHeapBlockBitVector *free_local;
  ushort freeCount;
  
  local_40 = free;
  memset(free,0,0x100);
  free_local._6_2_ = 0;
  this_00 = this->freeObjectList;
  if (this_00 != (FreeObject *)0x0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (((ulong)this_00 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar2) goto LAB_006b89b6;
        *puVar6 = 0;
      }
      uVar7 = (uint)((ulong)this_00 >> 4) & 0x7ff;
      bVar2 = IsValidBitIndex(this,uVar7);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x766,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
        if (!bVar2) goto LAB_006b89b6;
        *puVar6 = 0;
      }
      BVar3 = BVStatic<2048UL>::Test(&this->debugFreeBits,uVar7);
      if (BVar3 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x767,"(this->GetDebugFreeBitVector()->Test(bitIndex))",
                           "this->GetDebugFreeBitVector()->Test(bitIndex)");
        if (!bVar2) goto LAB_006b89b6;
        *puVar6 = 0;
      }
      BVStatic<2048UL>::Set(local_40,uVar7);
      free_local._6_2_ = free_local._6_2_ + 1;
      this_00 = FreeObject::GetNext(this_00);
    } while (this_00 != (FreeObject *)0x0);
  }
  BVar5 = BVStatic<2048UL>::Count(&this->debugFreeBits);
  if (BVar5 != free_local._6_2_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x76c,"(this->GetDebugFreeBitVector()->Count() == freeCount)",
                       "this->GetDebugFreeBitVector()->Count() == freeCount");
    if (!bVar2) goto LAB_006b89b6;
    *puVar6 = 0;
  }
  uVar7 = (uint)(this->super_HeapBlock).heapBlockType;
  if ((uVar7 < 0xb) && ((0x528U >> (uVar7 & 0x1f) & 1) != 0)) {
    this_01 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    fn.free = &local_40;
    fn.this = this;
    fn.freeCount = (ushort *)((long)&free_local + 6);
    SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::BuildFreeBitVector(BVStatic<2048ul>*)::_lambda(unsigned_int)_1_>
              (this_01,fn);
    uVar4 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
            AddDisposedObjectFreeBitVector(this_01,local_40);
    free_local._6_2_ = free_local._6_2_ + uVar4;
  }
  if (this->lastFreeCount < free_local._6_2_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x77f,"(freeCount <= this->lastFreeCount)",
                       "freeCount <= this->lastFreeCount");
    if (!bVar2) {
LAB_006b89b6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  return free_local._6_2_;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::BuildFreeBitVector(SmallHeapBlockBitVector * free)
{
    free->ClearAll();
    ushort freeCount = 0;
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        uint bitIndex = GetAddressBitIndex(freeObject);
        Assert(IsValidBitIndex(bitIndex));
        Assert(this->GetDebugFreeBitVector()->Test(bitIndex));
        free->Set(bitIndex);
        freeCount++;
        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == freeCount);

    if (this->IsAnyFinalizableBlock())
    {
        auto finalizableBlock = this->AsFinalizableBlock<TBlockAttributes>();

        // Include pending dispose objects
        finalizableBlock->ForEachPendingDisposeObject([&] (uint index) {
            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            free->Set(bitIndex);
            freeCount++;
        });

        // Include disposed objects
        freeCount += finalizableBlock->AddDisposedObjectFreeBitVector(free);
    }

    Assert(freeCount <= this->lastFreeCount);
    return freeCount;
}